

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  bool bVar1;
  uint16_t uVar2;
  CBB *out_00;
  
  out_00 = out;
  uVar2 = ssl_protocol_version(hs->ssl);
  if ((uVar2 < 0x304) &&
     ((hs->new_cipher->algorithm_auth & 4) != 0 || (hs->new_cipher->algorithm_mkey & 2) != 0)) {
    bVar1 = ext_ec_point_add_extension((SSL_HANDSHAKE *)out,out_00);
    return bVar1;
  }
  return true;
}

Assistant:

static bool ext_ec_point_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  const uint32_t alg_k = hs->new_cipher->algorithm_mkey;
  const uint32_t alg_a = hs->new_cipher->algorithm_auth;
  const bool using_ecc = (alg_k & SSL_kECDHE) || (alg_a & SSL_aECDSA);

  if (!using_ecc) {
    return true;
  }

  return ext_ec_point_add_extension(hs, out);
}